

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

int __thiscall luna::Lexer::LexSingleLineString(Lexer *this,TokenDetail *detail)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  String *pSVar4;
  LexException *in_RSI;
  long in_RDI;
  Lexer *in_stack_00000010;
  int quote;
  Lexer *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  State *in_stack_ffffffffffffffc0;
  char (*in_stack_ffffffffffffffd8) [31];
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar2 = *(int *)(in_RDI + 0x30);
  iVar1 = Next(in_stack_ffffffffffffffb0);
  *(int *)(in_RDI + 0x30) = iVar1;
  std::__cxx11::string::clear();
  while( true ) {
    if (*(int *)(in_RDI + 0x30) == iVar2) {
      iVar2 = Next(in_stack_ffffffffffffffb0);
      *(int *)(in_RDI + 0x30) = iVar2;
      pSVar4 = State::GetString(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      *(String **)&in_RSI->super_Exception = pSVar4;
      *(undefined4 *)&(in_RSI->super_Exception).field_0x18 = 0x116;
      *(undefined4 *)&(in_RSI->super_Exception).field_0x10 = *(undefined4 *)(in_RDI + 0x34);
      *(undefined4 *)&(in_RSI->super_Exception).field_0x14 = *(undefined4 *)(in_RDI + 0x38);
      *(undefined8 *)&(in_RSI->super_Exception).field_0x8 = *(undefined8 *)(in_RDI + 8);
      return 0x116;
    }
    if (*(int *)(in_RDI + 0x30) == -1) break;
    if ((*(int *)(in_RDI + 0x30) == 0xd) || (*(int *)(in_RDI + 0x30) == 10)) {
      uVar3 = __cxa_allocate_exception(0x20);
      String::GetCStr(*(String **)(in_RDI + 8));
      LexException::LexException<char_const(&)[31]>
                (in_RSI,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4,
                 in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      __cxa_throw(uVar3,&LexException::typeinfo,LexException::~LexException);
    }
    LexStringChar(in_stack_00000010);
  }
  uVar3 = __cxa_allocate_exception(0x20);
  String::GetCStr(*(String **)(in_RDI + 8));
  LexException::LexException<char_const(&)[27]>
            (in_RSI,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4,
             in_stack_ffffffffffffffe0,(char (*) [27])in_stack_ffffffffffffffd8);
  __cxa_throw(uVar3,&LexException::typeinfo,LexException::~LexException);
}

Assistant:

int Lexer::LexSingleLineString(TokenDetail *detail)
    {
        int quote = current_;
        current_ = Next();
        token_buffer_.clear();

        while (current_ != quote)
        {
            if (current_ == EOF)
                throw LexException(module_->GetCStr(), line_, column_,
                        "incomplete string at <eof>");

            if (current_ == '\r' || current_ == '\n')
                throw LexException(module_->GetCStr(), line_, column_,
                        "incomplete string at this line");

            LexStringChar();
        }

        current_ = Next();
        RETURN_TOKEN_DETAIL(detail, token_buffer_, Token_String);
    }